

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeCall(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  size_type sVar2;
  value_type *this_00;
  Expression *pEVar3;
  Iterator IVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  byte local_f2;
  bool local_f1;
  Expression *local_b8;
  uintptr_t *local_b0;
  Type *argType;
  Iterator __end2;
  Iterator __begin2;
  Type local_78;
  Type *local_70;
  Type *__range2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Type local_48;
  Type local_40;
  BasicType local_34;
  pointer local_30;
  Function *target;
  bool isReturn;
  TranslateToFuzzReader *pTStack_20;
  int tries;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  target._4_4_ = (this->fuzzParams->super_FuzzParams).TRIES;
  pTStack_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  do {
    if (target._4_4_ < 1) {
      target._4_4_ = target._4_4_ + -1;
      pEVar3 = makeTrivial(this,(Type)this_local);
      return pEVar3;
    }
    local_30 = this->funcContext->func;
    target._4_4_ = target._4_4_ + -1;
    bVar1 = std::
            vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ::empty(&this->wasm->functions);
    if (!bVar1) {
      sVar2 = std::
              vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ::size(&this->wasm->functions);
      bVar1 = oneIn(this,(Index)sVar2);
      if (!bVar1) {
        this_00 = pick<std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>>
                            (this,&this->wasm->functions);
        local_30 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                             (this_00);
      }
    }
    local_34 = unreachable;
    bVar1 = Type::operator==((Type *)&this_local,&local_34);
    local_f1 = false;
    if (bVar1) {
      bVar1 = FeatureSet::hasTailCall(&this->wasm->features);
      local_f1 = false;
      if (bVar1) {
        local_40 = Function::getResults(this->funcContext->func);
        local_48 = Function::getResults(local_30);
        local_f1 = Type::operator==(&local_40,&local_48);
      }
    }
    target._3_1_ = local_f1;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)Function::getResults(local_30);
    bVar1 = Type::operator!=((Type *)&args.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (Type *)&this_local);
    local_f2 = 0;
    if (bVar1) {
      local_f2 = target._3_1_ ^ 0xff;
    }
  } while ((local_f2 & 1) != 0);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
  local_78 = Function::getParams(local_30);
  local_70 = &local_78;
  IVar4 = Type::begin(local_70);
  __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)IVar4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
  PVar5 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(local_70);
  while( true ) {
    __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)PVar5.index;
    argType = PVar5.parent;
    bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                       &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                              &argType);
    if (!bVar1) break;
    local_b0 = (uintptr_t *)
               ::wasm::Type::Iterator::operator*
                         ((Iterator *)
                          &__end2.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         );
    local_b8 = make(this,(Type)*local_b0);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2,
               &local_b8);
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
               &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    PVar5.index = (size_t)__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .parent;
    PVar5.parent = argType;
  }
  type_local.id =
       (uintptr_t)
       Builder::makeCall(&this->builder,
                         (Name)(local_30->super_Importable).super_Named.name.super_IString.str,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         &__range2,(Type)this_local,(bool)(target._3_1_ & 1));
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeCall(Type type) {
  int tries = fuzzParams->TRIES;
  bool isReturn;
  while (tries-- > 0) {
    Function* target = funcContext->func;
    if (!wasm.functions.empty() && !oneIn(wasm.functions.size())) {
      target = pick(wasm.functions).get();
    }
    isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
               funcContext->func->getResults() == target->getResults();
    if (target->getResults() != type && !isReturn) {
      continue;
    }
    // we found one!
    std::vector<Expression*> args;
    for (const auto& argType : target->getParams()) {
      args.push_back(make(argType));
    }
    return builder.makeCall(target->name, args, type, isReturn);
  }
  // we failed to find something
  return makeTrivial(type);
}